

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Promise<bool> __thiscall
kj::anon_unknown_36::HttpInputStreamImpl::awaitNextMessage(HttpInputStreamImpl *this)

{
  Coroutine<bool> *this_00;
  PromiseAwaiter<void> *this_01;
  PromiseAwaiter<unsigned_long> *__return_storage_ptr__;
  Promise<unsigned_long> *promise;
  PromiseArenaMember *pPVar1;
  long *plVar2;
  HttpInputStreamImpl *pHVar3;
  long lVar4;
  SourceLocation location;
  bool bVar5;
  coroutine_handle<void> coroutine;
  unsigned_long uVar6;
  long in_RSI;
  FixVoid<bool> *value;
  char *local_58;
  char *pcStack_50;
  _func_int **local_48;
  EventLoop *local_40;
  PromiseBase local_38;
  
  coroutine._M_fr_ptr = operator_new(0x628);
  *(code **)coroutine._M_fr_ptr = awaitNextMessage;
  *(code **)((long)coroutine._M_fr_ptr + 8) = awaitNextMessage;
  this_00 = (Coroutine<bool> *)((long)coroutine._M_fr_ptr + 0x10);
  *(long *)((long)coroutine._M_fr_ptr + 0x610) = in_RSI;
  local_58 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  pcStack_50 = "awaitNextMessage";
  local_48 = (_func_int **)0x15000005d2;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_0061ea88;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_0061ead0;
  location.function = "awaitNextMessage";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x5d2;
  location.columnNumber = 0x15;
  kj::_::CoroutineBase::CoroutineBase
            ((CoroutineBase *)this_00,coroutine,
             (ExceptionOrValue *)((long)coroutine._M_fr_ptr + 0x98),location);
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_0061ea88;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_0061ead0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x98) = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x230) = 0;
  (this->super_HttpInputStream)._vptr_HttpInputStream = (_func_int **)this_00;
  local_38.node.ptr = (OwnPromiseNode)(OwnPromiseNode)this;
  if (*(char *)(in_RSI + 0xa8) == '\x01') {
    value = (FixVoid<bool> *)((long)coroutine._M_fr_ptr + 0x623);
  }
  else {
    if (*(long *)(in_RSI + 0xe0) != 0) {
      *(char **)((long)coroutine._M_fr_ptr + 0x5e0) =
           "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
      ;
      *(char **)((long)coroutine._M_fr_ptr + 0x5e8) = "awaitNextMessage";
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x5f0) = 0x13000005e1;
      Promise<void>::fork((Promise<void> *)((long)coroutine._M_fr_ptr + 0x5f8));
      kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)&stack0xffffffffffffffa8);
      pPVar1 = *(PromiseArenaMember **)(in_RSI + 0xe8);
      *(char **)(in_RSI + 0xe8) = local_58;
      local_58 = (char *)0x0;
      if ((pPVar1 != (PromiseArenaMember *)0x0) &&
         (kj::_::PromiseDisposer::dispose(pPVar1), pPVar1 = (PromiseArenaMember *)local_58,
         (PromiseArenaMember *)local_58 != (PromiseArenaMember *)0x0)) {
        local_58 = (char *)0x0;
        kj::_::PromiseDisposer::dispose(pPVar1);
      }
      kj::_::ForkedPromiseAwaiter<void>::ForkedPromiseAwaiter
                ((ForkedPromiseAwaiter<void> *)((long)coroutine._M_fr_ptr + 0x238),
                 (ForkedPromise<void> *)((long)coroutine._M_fr_ptr + 0x5f8));
      *(undefined1 *)((long)coroutine._M_fr_ptr + 0x620) = 0;
      this_01 = (PromiseAwaiter<void> *)((long)coroutine._M_fr_ptr + 0x268);
      bVar5 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                        ((PromiseAwaiterBase *)this_01,(CoroutineBase *)this_00);
      if (bVar5) {
        return (Promise<bool>)(PromiseNode *)local_38.node.ptr;
      }
      kj::_::PromiseAwaiter<void>::await_resume(this_01);
      if (*(char *)((long)coroutine._M_fr_ptr + 0x280) == '\x01') {
        Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0x288));
      }
      kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)this_01);
      kj::_::ForkBranchBase::~ForkBranchBase((ForkBranchBase *)((long)coroutine._M_fr_ptr + 0x238));
      plVar2 = *(long **)((long)coroutine._M_fr_ptr + 0x600);
      if (plVar2 != (long *)0x0) {
        *(undefined8 *)((long)coroutine._M_fr_ptr + 0x600) = 0;
        (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0x5f8))
                  (*(undefined8 **)((long)coroutine._M_fr_ptr + 0x5f8),
                   (long)plVar2 + *(long *)(*plVar2 + -0x10));
      }
    }
    value = (FixVoid<bool> *)((long)coroutine._M_fr_ptr + 0x622);
    pHVar3 = *(HttpInputStreamImpl **)((long)coroutine._M_fr_ptr + 0x610);
    snarfBufferedLineBreak(pHVar3);
    if ((pHVar3->lineBreakBeforeNextHeader != false) || ((pHVar3->leftover).size_ == 0)) {
      __return_storage_ptr__ = (PromiseAwaiter<unsigned_long> *)((long)coroutine._M_fr_ptr + 0x420);
      promise = (Promise<unsigned_long> *)((long)coroutine._M_fr_ptr + 0x608);
      local_40 = (EventLoop *)((long)coroutine._M_fr_ptr + 0x621);
      do {
        lVar4 = *(long *)((long)coroutine._M_fr_ptr + 0x610);
        (**(code **)(**(long **)(lVar4 + 0x10) + 8))
                  (promise,*(long **)(lVar4 + 0x10),*(undefined8 *)(lVar4 + 0x18),1,
                   *(undefined8 *)(lVar4 + 0x20));
        co_await<unsigned_long>(__return_storage_ptr__,promise);
        *(undefined1 *)((long)coroutine._M_fr_ptr + 0x620) = 1;
        bVar5 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                          ((PromiseAwaiterBase *)__return_storage_ptr__,(CoroutineBase *)this_00);
        if (bVar5) {
          return (Promise<bool>)(PromiseNode *)local_38.node.ptr;
        }
        uVar6 = kj::_::PromiseAwaiter<unsigned_long>::await_resume(__return_storage_ptr__);
        if (*(char *)((long)coroutine._M_fr_ptr + 0x438) == '\x01') {
          Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0x440));
        }
        kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)__return_storage_ptr__)
        ;
        pPVar1 = &((promise->super_PromiseBase).node.ptr)->super_PromiseArenaMember;
        if (pPVar1 != (PromiseArenaMember *)0x0) {
          (promise->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
          kj::_::PromiseDisposer::dispose(pPVar1);
        }
        if (uVar6 == 0) {
          *(FixVoid<bool> *)&(local_40->port).ptr = false;
          kj::_::Coroutine<bool>::fulfill(this_00,(FixVoid<bool> *)local_40);
          goto LAB_00394bcd;
        }
        lVar4 = *(long *)((long)coroutine._M_fr_ptr + 0x610);
        *(undefined8 *)(lVar4 + 0x38) = *(undefined8 *)(lVar4 + 0x18);
        *(unsigned_long *)(lVar4 + 0x40) = uVar6;
        *(unsigned_long *)((long)coroutine._M_fr_ptr + 0x618) = uVar6;
        pHVar3 = *(HttpInputStreamImpl **)((long)coroutine._M_fr_ptr + 0x610);
        snarfBufferedLineBreak(pHVar3);
      } while ((pHVar3->lineBreakBeforeNextHeader != false) || ((pHVar3->leftover).size_ == 0));
    }
  }
  *value = true;
  kj::_::Coroutine<bool>::fulfill(this_00,value);
LAB_00394bcd:
  *(undefined8 *)coroutine._M_fr_ptr = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x620) = 2;
  return (Promise<bool>)(PromiseNode *)local_38.node.ptr;
}

Assistant:

kj::Promise<bool> awaitNextMessage() override {
    // Waits until more data is available, but doesn't consume it. Returns false on EOF.
    //
    // Used on the server after a request is handled, to check for pipelined requests.
    //
    // Used on the client to detect when idle connections are closed from the server end. (In this
    // case, the promise always returns false or is canceled.)

    if (resumingRequest != kj::none) {
      // We're resuming a request, so report that we have a message.
      co_return true;
    }

    if (onMessageDone != kj::none) {
      // We're still working on reading the previous body.
      auto fork = messageReadQueue.fork();
      messageReadQueue = fork.addBranch();
      co_await fork;
    }

    for (;;) {
      snarfBufferedLineBreak();

      if (!lineBreakBeforeNextHeader && leftover != nullptr) {
        co_return true;
      }

      auto amount = co_await inner.tryRead(headerBuffer.begin(), 1, headerBuffer.size());
      if (amount == 0) {
        co_return false;
      }

      leftover = headerBuffer.first(amount);
    }
  }